

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::FiberPool::Impl::Impl(Impl *this,size_t stackSize)

{
  unsigned_long uVar1;
  size_t stackSize_local;
  Impl *this_local;
  
  Disposer::Disposer(&this->super_Disposer);
  (this->super_Disposer)._vptr_Disposer = (_func_int **)&PTR_disposeImpl_0059fd38;
  this->stackSize = stackSize;
  uVar1 = MaxValue_::operator_cast_to_unsigned_long((MaxValue_ *)&maxValue);
  this->maxFreelist = uVar1;
  MutexGuarded<std::deque<kj::_::FiberStack_*,_std::allocator<kj::_::FiberStack_*>_>_>::
  MutexGuarded<>(&this->freelist);
  this->coreLocalFreelists = (CoreLocalFreelist *)0x0;
  return;
}

Assistant:

Impl(size_t stackSize): stackSize(stackSize) {}